

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintHelpOneCommand(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  cmDocumentation *this_00;
  string cname;
  
  cmsys::SystemTools::LowerCase((string *)&stack0xffffffffffffffc0,&this->CurrentArgument);
  this_00 = (cmDocumentation *)&stack0xffffffffffffffa0;
  cmStrCat<char_const(&)[9],std::__cxx11::string&>
            ((string *)this_00,(char (*) [9])"command/",(string *)&stack0xffffffffffffffc0);
  bVar1 = PrintFiles(this_00,os,(string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"Argument \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->CurrentArgument);
    std::operator<<(poVar2,
                    "\" to --help-command is not a CMake command.  Use --help-command-list to see all commands.\n"
                   );
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneCommand(std::ostream& os)
{
  std::string cname = cmSystemTools::LowerCase(this->CurrentArgument);
  if (this->PrintFiles(os, cmStrCat("command/", cname))) {
    return true;
  }
  // Argument was not a command.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-command is not a CMake command.  "
        "Use --help-command-list to see all commands.\n";
  return false;
}